

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStrMatParInterface.h
# Opt level: O2

void __thiscall TPZStructMatrixOT<double>::TPZStructMatrixOT(TPZStructMatrixOT<double> *this)

{
  *(undefined4 *)&this->field_0x88 = 0;
  this->field_0x8c = 1;
  *(undefined8 *)&this->field_0x80 = 0x17d96d8;
  *(undefined8 *)this = 0x17d95d0;
  (this->fElBlocked)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fElBlocked).fNAlloc = 0;
  (this->fElBlocked).fStore = (long *)0x0;
  (this->fElBlocked).fNElements = 0;
  (this->fElSequenceColor)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fElSequenceColor).fStore = (long *)0x0;
  (this->fElSequenceColor).fNElements = 0;
  (this->fElSequenceColor).fNAlloc = 0;
  (this->fElementsComputed)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fElementsComputed).fStore = (long *)0x0;
  (this->fElementsComputed).fNElements = 0;
  (this->fElementsComputed).fNAlloc = 0;
  return;
}

Assistant:

TPZStrMatParInterface(TPZStrMatParInterface&&) = default;